

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

SslTcpSocket * SslTcpSocketImpl::SwitchToSsl(TcpSocket *pTcpSocket)

{
  BaseSocket *this;
  BaseSocketImpl *pBVar1;
  _Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  _Var2;
  pointer *__ptr;
  __uniq_ptr_impl<BaseSocket,_std::default_delete<BaseSocket>_> local_48;
  _Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_unsigned_char_*,_unsigned_long,_bool_&)>
  local_40;
  
  std::make_unique<SslTcpSocket,TcpSocket*&>((TcpSocket **)&local_40);
  local_48._M_t.super__Tuple_impl<0UL,_BaseSocket_*,_std::default_delete<BaseSocket>_>.
  super__Head_base<0UL,_BaseSocket_*,_false>._M_head_impl =
       (tuple<BaseSocket_*,_std::default_delete<BaseSocket>_>)
       (tuple<BaseSocket_*,_std::default_delete<BaseSocket>_>)local_40._M_f;
  this = (BaseSocket *)__dynamic_cast(local_40._M_f,&BaseSocket::typeinfo,&SslTcpSocket::typeinfo,0)
  ;
  pBVar1 = BaseSocket::GetImpl(this);
  _Var2.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Head_base<0UL,_SslTcpSocketImpl_*,_false>)
       __dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&typeinfo,0);
  local_40._M_f = (offset_in_SslTcpSocketImpl_to_subr)DatenEncode;
  local_40._8_8_ = 0;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )_Var2.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl;
  std::function<int(unsigned_char_const*,unsigned_long)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long)> *)
             ((long)_Var2.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl + 0x248),
             (_Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_unsigned_char_*,_unsigned_long)>
              *)&local_40);
  local_40._M_f = (offset_in_SslTcpSocketImpl_to_subr)DatenDecode;
  local_40._8_8_ = 0;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )_Var2.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl;
  std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)
             ((long)_Var2.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl + 0x1a8),
             &local_40);
  std::mutex::lock(&BaseSocketImpl::s_mxClientSocket);
  std::
  deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
  ::emplace_back<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>
            ((deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
              *)&BaseSocketImpl::s_lstClientSocket,
             (unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> *)&local_48);
  pthread_mutex_unlock((pthread_mutex_t *)&BaseSocketImpl::s_mxClientSocket);
  if ((_Tuple_impl<0UL,_BaseSocket_*,_std::default_delete<BaseSocket>_>)
      local_48._M_t.super__Tuple_impl<0UL,_BaseSocket_*,_std::default_delete<BaseSocket>_>.
      super__Head_base<0UL,_BaseSocket_*,_false>._M_head_impl != (BaseSocket *)0x0) {
    (**(code **)(*(long *)local_48._M_t.
                          super__Tuple_impl<0UL,_BaseSocket_*,_std::default_delete<BaseSocket>_>.
                          super__Head_base<0UL,_BaseSocket_*,_false>._M_head_impl + 8))();
  }
  return (SslTcpSocket *)this;
}

Assistant:

SslTcpSocket* SslTcpSocketImpl::SwitchToSsl(TcpSocket* pTcpSocket)
{
    unique_ptr<BaseSocket> pSslTcpSocket = make_unique<SslTcpSocket>(pTcpSocket);
    SslTcpSocket* pSslTcpSock = dynamic_cast<SslTcpSocket*>(pSslTcpSocket.get());
    SslTcpSocketImpl* pSslTcpSocketImpl = dynamic_cast<SslTcpSocketImpl*>(pSslTcpSock->GetImpl());

    pSslTcpSocketImpl->m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, pSslTcpSocketImpl, _1, _2);
    pSslTcpSocketImpl->m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, pSslTcpSocketImpl, _1, _2, _3);

    lock_guard<mutex> lock(s_mxClientSocket);
    s_lstClientSocket.push_back(move(pSslTcpSocket));

    return pSslTcpSock;
}